

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O2

void beltWBLStepDBase(void *buf,size_t count,void *state)

{
  ulong *src;
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  ulong *puVar4;
  
  src = (ulong *)((long)state + 0x40);
  uVar1 = count + 0xf >> 3 & 0xfffffffffffffffe;
  while (*src = uVar1, uVar1 != 0) {
    *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)buf + (count - 0x10));
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf + (count - 8));
    memMove((void *)((long)buf + 0x10),buf,count - 0x10);
    *(undefined8 *)buf = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)buf + 8) = *(undefined8 *)((long)state + 0x28);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    memXor2((octet *)((long)state + 0x20),src,8);
    puVar3 = (ulong *)((long)buf + (count - 0x10));
    *puVar3 = *puVar3 ^ *(ulong *)((long)state + 0x20);
    lVar2 = 0x10;
    puVar3 = (ulong *)((long)state + 0x28);
    puVar4 = (ulong *)((long)buf + (count - 8));
    for (uVar1 = 0x20; *puVar4 = *puVar4 ^ *puVar3, uVar1 < count; uVar1 = uVar1 + 0x10) {
      *(ulong *)buf = *buf ^ *(ulong *)((long)buf + (uVar1 - 0x10));
      puVar3 = (ulong *)((long)buf + lVar2 + 8);
      lVar2 = lVar2 + 0x10;
      puVar4 = (ulong *)((long)buf + 8);
    }
    uVar1 = *src - 1;
  }
  return;
}

Assistant:

void beltWBLStepDBase(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, (octet*)buf + count - 16);
		// r <- ShHi^128(r)
		memMove((octet*)buf + 16, buf, count - 16);
		// r1 <- block
		beltBlockCopy(buf, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + count - 16, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 16 < count; i += 16)
			beltBlockXor2(buf, (octet*)buf + i);
	}
}